

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  vfloat<4> vVar4;
  BVH *bvh;
  size_t sVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool bVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  byte bVar26;
  byte bVar27;
  NodeRef *pNVar28;
  size_t sVar29;
  byte bVar30;
  size_t sVar31;
  byte bVar32;
  uint uVar33;
  size_t i_1;
  long lVar34;
  NodeRef root;
  undefined4 uVar35;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar95;
  undefined1 auVar91 [16];
  float fVar93;
  float fVar94;
  undefined1 auVar92 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  uint local_1a18;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  undefined1 local_19a8 [16];
  RayK<4> *local_1998;
  undefined4 local_1990;
  undefined4 local_198c;
  undefined1 local_1988 [16];
  undefined1 local_1978 [16];
  undefined1 local_1968 [16];
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_18f8;
  undefined1 local_18c8 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_18b8;
  undefined1 local_18a8 [16];
  undefined1 local_1898 [16];
  uint local_1888;
  uint uStack_1884;
  uint uStack_1880;
  uint uStack_187c;
  uint uStack_1878;
  uint uStack_1874;
  uint uStack_1870;
  uint uStack_186c;
  undefined8 local_1868;
  undefined8 uStack_1860;
  TravRayK<4,_true> tray;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar38 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar42 = ZEXT816(0) << 0x40;
    uVar11 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar42,5);
    uVar37 = vpcmpeqd_avx512vl(auVar38,(undefined1  [16])valid_i->field_0);
    uVar37 = ((byte)uVar11 & 0xf) & uVar37;
    bVar32 = (byte)uVar37;
    if (bVar32 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar98 = ZEXT1664(auVar38);
      auVar39 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar38);
      auVar62._8_4_ = 0x219392ef;
      auVar62._0_8_ = 0x219392ef219392ef;
      auVar62._12_4_ = 0x219392ef;
      uVar12 = vcmpps_avx512vl(auVar39,auVar62,1);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar99 = ZEXT1664(auVar39);
      auVar40 = vdivps_avx512vl(auVar39,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar41 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar38);
      uVar13 = vcmpps_avx512vl(auVar41,auVar62,1);
      auVar41 = vdivps_avx512vl(auVar39,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar38 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar38);
      uVar14 = vcmpps_avx512vl(auVar38,auVar62,1);
      auVar38 = vdivps_avx512vl(auVar39,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar21 = (bool)((byte)uVar12 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar21 * 0x5d5e0b6b | (uint)!bVar21 * auVar40._0_4_;
      bVar21 = (bool)((byte)(uVar12 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar21 * 0x5d5e0b6b | (uint)!bVar21 * auVar40._4_4_;
      bVar21 = (bool)((byte)(uVar12 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar21 * 0x5d5e0b6b | (uint)!bVar21 * auVar40._8_4_;
      bVar21 = (bool)((byte)(uVar12 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar21 * 0x5d5e0b6b | (uint)!bVar21 * auVar40._12_4_;
      bVar21 = (bool)((byte)uVar13 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar21 * 0x5d5e0b6b | (uint)!bVar21 * auVar41._0_4_;
      bVar21 = (bool)((byte)(uVar13 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar21 * 0x5d5e0b6b | (uint)!bVar21 * auVar41._4_4_;
      bVar21 = (bool)((byte)(uVar13 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar21 * 0x5d5e0b6b | (uint)!bVar21 * auVar41._8_4_;
      bVar21 = (bool)((byte)(uVar13 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar21 * 0x5d5e0b6b | (uint)!bVar21 * auVar41._12_4_;
      bVar21 = (bool)((byte)uVar14 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar21 * 0x5d5e0b6b | (uint)!bVar21 * auVar38._0_4_;
      bVar21 = (bool)((byte)(uVar14 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar21 * 0x5d5e0b6b | (uint)!bVar21 * auVar38._4_4_;
      bVar21 = (bool)((byte)(uVar14 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar21 * 0x5d5e0b6b | (uint)!bVar21 * auVar38._8_4_;
      bVar21 = (bool)((byte)(uVar14 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar21 * 0x5d5e0b6b | (uint)!bVar21 * auVar38._12_4_;
      uVar12 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar42,1);
      auVar38 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar12 & 1) * auVar38._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar38._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar38._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar38._12_4_;
      local_1990 = (undefined4)uVar37;
      uVar12 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar42,5);
      auVar38 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar21 = (bool)((byte)uVar12 & 1);
      bVar8 = (bool)((byte)(uVar12 >> 1) & 1);
      bVar9 = (bool)((byte)(uVar12 >> 2) & 1);
      bVar10 = (bool)((byte)(uVar12 >> 3) & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar21 * auVar38._0_4_ | (uint)!bVar21 * 0x30;
      tray.nearXYZ.field_0._20_4_ = (uint)bVar8 * auVar38._4_4_ | (uint)!bVar8 * 0x30;
      tray.nearXYZ.field_0._24_4_ = (uint)bVar9 * auVar38._8_4_ | (uint)!bVar9 * 0x30;
      tray.nearXYZ.field_0._28_4_ = (uint)bVar10 * auVar38._12_4_ | (uint)!bVar10 * 0x30;
      uVar12 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar42,5);
      auVar38 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar21 = (bool)((byte)uVar12 & 1);
      bVar8 = (bool)((byte)(uVar12 >> 1) & 1);
      bVar9 = (bool)((byte)(uVar12 >> 2) & 1);
      bVar10 = (bool)((byte)(uVar12 >> 3) & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar21 * auVar38._0_4_ | (uint)!bVar21 * 0x50;
      tray.nearXYZ.field_0._36_4_ = (uint)bVar8 * auVar38._4_4_ | (uint)!bVar8 * 0x50;
      tray.nearXYZ.field_0._40_4_ = (uint)bVar9 * auVar38._8_4_ | (uint)!bVar9 * 0x50;
      tray.nearXYZ.field_0._44_4_ = (uint)bVar10 * auVar38._12_4_ | (uint)!bVar10 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar100 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar38 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar42);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar32 & 1) * auVar38._0_4_ |
           (uint)!(bool)(bVar32 & 1) * stack_near[0].field_0._0_4_;
      bVar21 = (bool)((byte)(uVar37 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar21 * auVar38._4_4_ | (uint)!bVar21 * stack_near[0].field_0._4_4_;
      bVar21 = (bool)((byte)(uVar37 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar21 * auVar38._8_4_ | (uint)!bVar21 * stack_near[0].field_0._8_4_;
      bVar21 = SUB81(uVar37 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar21 * auVar38._12_4_ | (uint)!bVar21 * stack_near[0].field_0._12_4_;
      auVar38 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar42);
      tray.tfar.field_0.i[0] =
           (uint)(bVar32 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar32 & 1) * -0x800000;
      bVar21 = (bool)((byte)(uVar37 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar21 * auVar38._4_4_ | (uint)!bVar21 * -0x800000;
      bVar21 = (bool)((byte)(uVar37 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar21 * auVar38._8_4_ | (uint)!bVar21 * -0x800000;
      bVar21 = SUB81(uVar37 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar21 * auVar38._12_4_ | (uint)!bVar21 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar33 = 3;
      }
      else {
        uVar33 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1998 = ray + 0x80;
      local_1a18 = (byte)((ushort)((short)uVar37 << 0xc) >> 0xc) ^ 0xf;
      pNVar28 = stack_node + 2;
      paVar36 = &stack_near[2].field_0;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar101 = ZEXT1664(auVar38);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar102 = ZEXT1664(auVar38);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
      auVar103 = ZEXT1664(auVar38);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar97 = ZEXT1664(auVar38);
LAB_01c950e4:
      do {
        bVar32 = (byte)local_1a18;
        do {
          root.ptr = pNVar28[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01c9649e;
          pNVar28 = pNVar28 + -1;
          vVar4.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar36[-1].v;
          auVar92 = ZEXT1664((undefined1  [16])vVar4.field_0);
          paVar36 = paVar36 + -1;
          uVar37 = vcmpps_avx512vl((undefined1  [16])vVar4.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar37 == '\0');
        uVar35 = (undefined4)uVar37;
        if (uVar33 < (uint)POPCOUNT(uVar35)) {
LAB_01c9512c:
          do {
            bVar32 = (byte)local_1a18;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01c9649e;
              uVar11 = vcmpps_avx512vl(auVar92._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar11 == '\0') goto LAB_01c950e4;
              bVar30 = ~bVar32 & 0xf;
              lVar25 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              lVar24 = 0;
              goto LAB_01c9530d;
            }
            sVar31 = 8;
            aVar72 = auVar100._0_16_;
            for (lVar25 = 0;
                (auVar92 = ZEXT1664((undefined1  [16])aVar72), lVar25 != 4 &&
                (sVar5 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar25 * 8), sVar5 != 8));
                lVar25 = lVar25 + 1) {
              uVar35 = *(undefined4 *)(root.ptr + 0x20 + lVar25 * 4);
              auVar66._4_4_ = uVar35;
              auVar66._0_4_ = uVar35;
              auVar66._8_4_ = uVar35;
              auVar66._12_4_ = uVar35;
              auVar18._8_8_ = tray.org.field_0._8_8_;
              auVar18._0_8_ = tray.org.field_0._0_8_;
              auVar19._8_8_ = tray.org.field_0._24_8_;
              auVar19._0_8_ = tray.org.field_0._16_8_;
              auVar20._8_8_ = tray.org.field_0._40_8_;
              auVar20._0_8_ = tray.org.field_0._32_8_;
              auVar38 = vsubps_avx(auVar66,auVar18);
              auVar85._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar38._0_4_;
              auVar85._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar38._4_4_;
              auVar85._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar38._8_4_;
              auVar85._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar38._12_4_;
              uVar35 = *(undefined4 *)(root.ptr + 0x40 + lVar25 * 4);
              auVar67._4_4_ = uVar35;
              auVar67._0_4_ = uVar35;
              auVar67._8_4_ = uVar35;
              auVar67._12_4_ = uVar35;
              auVar38 = vsubps_avx(auVar67,auVar19);
              auVar87._0_4_ = tray.rdir.field_0._16_4_ * auVar38._0_4_;
              auVar87._4_4_ = tray.rdir.field_0._20_4_ * auVar38._4_4_;
              auVar87._8_4_ = tray.rdir.field_0._24_4_ * auVar38._8_4_;
              auVar87._12_4_ = tray.rdir.field_0._28_4_ * auVar38._12_4_;
              uVar35 = *(undefined4 *)(root.ptr + 0x60 + lVar25 * 4);
              auVar68._4_4_ = uVar35;
              auVar68._0_4_ = uVar35;
              auVar68._8_4_ = uVar35;
              auVar68._12_4_ = uVar35;
              auVar38 = vsubps_avx(auVar68,auVar20);
              auVar89._0_4_ = tray.rdir.field_0._32_4_ * auVar38._0_4_;
              auVar89._4_4_ = tray.rdir.field_0._36_4_ * auVar38._4_4_;
              auVar89._8_4_ = tray.rdir.field_0._40_4_ * auVar38._8_4_;
              auVar89._12_4_ = tray.rdir.field_0._44_4_ * auVar38._12_4_;
              uVar35 = *(undefined4 *)(root.ptr + 0x30 + lVar25 * 4);
              auVar69._4_4_ = uVar35;
              auVar69._0_4_ = uVar35;
              auVar69._8_4_ = uVar35;
              auVar69._12_4_ = uVar35;
              auVar38 = vsubps_avx(auVar69,auVar18);
              auVar73._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar38._0_4_;
              auVar73._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar38._4_4_;
              auVar73._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar38._8_4_;
              auVar73._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar38._12_4_;
              uVar35 = *(undefined4 *)(root.ptr + 0x50 + lVar25 * 4);
              auVar70._4_4_ = uVar35;
              auVar70._0_4_ = uVar35;
              auVar70._8_4_ = uVar35;
              auVar70._12_4_ = uVar35;
              auVar38 = vsubps_avx(auVar70,auVar19);
              auVar75._0_4_ = tray.rdir.field_0._16_4_ * auVar38._0_4_;
              auVar75._4_4_ = tray.rdir.field_0._20_4_ * auVar38._4_4_;
              auVar75._8_4_ = tray.rdir.field_0._24_4_ * auVar38._8_4_;
              auVar75._12_4_ = tray.rdir.field_0._28_4_ * auVar38._12_4_;
              uVar35 = *(undefined4 *)(root.ptr + 0x70 + lVar25 * 4);
              auVar71._4_4_ = uVar35;
              auVar71._0_4_ = uVar35;
              auVar71._8_4_ = uVar35;
              auVar71._12_4_ = uVar35;
              auVar38 = vsubps_avx(auVar71,auVar20);
              auVar78._0_4_ = tray.rdir.field_0._32_4_ * auVar38._0_4_;
              auVar78._4_4_ = tray.rdir.field_0._36_4_ * auVar38._4_4_;
              auVar78._8_4_ = tray.rdir.field_0._40_4_ * auVar38._8_4_;
              auVar78._12_4_ = tray.rdir.field_0._44_4_ * auVar38._12_4_;
              auVar38 = vminps_avx(auVar85,auVar73);
              auVar42 = vminps_avx(auVar87,auVar75);
              auVar38 = vmaxps_avx(auVar38,auVar42);
              auVar42 = vminps_avx(auVar89,auVar78);
              auVar38 = vmaxps_avx(auVar38,auVar42);
              auVar39 = vmulps_avx512vl(auVar38,auVar101._0_16_);
              auVar38 = vmaxps_avx(auVar85,auVar73);
              auVar42 = vmaxps_avx(auVar87,auVar75);
              auVar42 = vminps_avx(auVar38,auVar42);
              auVar38 = vmaxps_avx(auVar89,auVar78);
              auVar38 = vminps_avx(auVar42,auVar38);
              auVar42 = vmulps_avx512vl(auVar38,auVar102._0_16_);
              auVar38 = vmaxps_avx(auVar39,(undefined1  [16])tray.tnear.field_0);
              auVar42 = vminps_avx(auVar42,(undefined1  [16])tray.tfar.field_0);
              uVar37 = vcmpps_avx512vl(auVar38,auVar42,2);
              sVar29 = sVar31;
              aVar43 = aVar72;
              if ((byte)uVar37 != 0) {
                auVar38 = vblendmps_avx512vl((undefined1  [16])auVar100._0_16_,auVar39);
                bVar21 = (bool)((byte)uVar37 & 1);
                aVar43._0_4_ = (uint)bVar21 * auVar38._0_4_ | (uint)!bVar21 * auVar39._0_4_;
                bVar21 = (bool)((byte)(uVar37 >> 1) & 1);
                aVar43._4_4_ = (uint)bVar21 * auVar38._4_4_ | (uint)!bVar21 * auVar39._4_4_;
                bVar21 = (bool)((byte)(uVar37 >> 2) & 1);
                aVar43._8_4_ = (uint)bVar21 * auVar38._8_4_ | (uint)!bVar21 * auVar39._8_4_;
                bVar21 = (bool)((byte)(uVar37 >> 3) & 1);
                aVar43._12_4_ = (uint)bVar21 * auVar38._12_4_ | (uint)!bVar21 * auVar39._12_4_;
                sVar29 = sVar5;
                if (sVar31 != 8) {
                  pNVar28->ptr = sVar31;
                  pNVar28 = pNVar28 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar36->v = aVar72;
                  paVar36 = paVar36 + 1;
                }
              }
              aVar72 = aVar43;
              sVar31 = sVar29;
            }
            if (sVar31 == 8) goto LAB_01c952ac;
            uVar11 = vcmpps_avx512vl((undefined1  [16])aVar72,(undefined1  [16])tray.tfar.field_0,9)
            ;
            root.ptr = sVar31;
          } while ((byte)uVar33 < (byte)POPCOUNT((int)uVar11));
          pNVar28->ptr = sVar31;
          pNVar28 = pNVar28 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar36->v = aVar72;
          paVar36 = paVar36 + 1;
LAB_01c952ac:
          iVar22 = 4;
        }
        else {
          while (bVar32 = (byte)local_1a18, uVar37 != 0) {
            sVar31 = 0;
            for (uVar12 = uVar37; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
              sVar31 = sVar31 + 1;
            }
            uVar37 = uVar37 - 1 & uVar37;
            bVar21 = occluded1(This,bvh,root,sVar31,&pre,ray,&tray,context);
            bVar30 = (byte)(1 << ((uint)sVar31 & 0x1f));
            if (!bVar21) {
              bVar30 = 0;
            }
            local_1a18 = (uint)(bVar32 | bVar30);
          }
          iVar22 = 3;
          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar98 = ZEXT1664(auVar38);
          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar99 = ZEXT1664(auVar38);
          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar100 = ZEXT1664(auVar38);
          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar101 = ZEXT1664(auVar38);
          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar102 = ZEXT1664(auVar38);
          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
          auVar103 = ZEXT1664(auVar38);
          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar97 = ZEXT1664(auVar38);
          auVar92 = ZEXT1664((undefined1  [16])vVar4.field_0);
          if (bVar32 != 0xf) {
            auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)(bVar32 & 1) * auVar38._0_4_ |
                 (uint)!(bool)(bVar32 & 1) * tray.tfar.field_0.i[0];
            bVar21 = (bool)((byte)(local_1a18 >> 1) & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar21 * auVar38._4_4_ | (uint)!bVar21 * tray.tfar.field_0.i[1];
            bVar21 = (bool)((byte)(local_1a18 >> 2) & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar21 * auVar38._8_4_ | (uint)!bVar21 * tray.tfar.field_0.i[2];
            bVar21 = (bool)((byte)(local_1a18 >> 3) & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar21 * auVar38._12_4_ | (uint)!bVar21 * tray.tfar.field_0.i[3];
            iVar22 = 2;
          }
          if (uVar33 < (uint)POPCOUNT(uVar35)) goto LAB_01c9512c;
        }
        bVar32 = (byte)local_1a18;
      } while (iVar22 != 3);
LAB_01c9649e:
      bVar32 = bVar32 & (byte)local_1990;
      bVar21 = (bool)(bVar32 >> 1 & 1);
      bVar8 = (bool)(bVar32 >> 2 & 1);
      bVar9 = (bool)(bVar32 >> 3 & 1);
      *(uint *)local_1998 =
           (uint)(bVar32 & 1) * -0x800000 | (uint)!(bool)(bVar32 & 1) * *(int *)local_1998;
      *(uint *)(local_1998 + 4) =
           (uint)bVar21 * -0x800000 | (uint)!bVar21 * *(int *)(local_1998 + 4);
      *(uint *)(local_1998 + 8) = (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_1998 + 8);
      *(uint *)(local_1998 + 0xc) =
           (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(local_1998 + 0xc);
    }
  }
  return;
LAB_01c9530d:
  do {
    if (lVar24 == (ulong)((uint)root.ptr & 0xf) - 8) goto LAB_01c96357;
    lVar23 = lVar24 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    lVar34 = 0;
    bVar27 = bVar30;
    do {
      if ((lVar34 == 4) ||
         (uVar37 = CONCAT44(0,*(uint *)(lVar25 + lVar34 * 4)), uVar37 == 0xffffffff))
      goto LAB_01c9633a;
      uVar35 = *(undefined4 *)(lVar25 + -0xc0 + lVar34 * 4);
      auVar64._4_4_ = uVar35;
      auVar64._0_4_ = uVar35;
      auVar64._8_4_ = uVar35;
      auVar64._12_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar25 + -0xb0 + lVar34 * 4);
      auVar74._4_4_ = uVar35;
      auVar74._0_4_ = uVar35;
      auVar74._8_4_ = uVar35;
      auVar74._12_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar25 + -0xa0 + lVar34 * 4);
      auVar76._4_4_ = uVar35;
      auVar76._0_4_ = uVar35;
      auVar76._8_4_ = uVar35;
      auVar76._12_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar25 + -0x90 + lVar34 * 4);
      local_1978._4_4_ = uVar35;
      local_1978._0_4_ = uVar35;
      local_1978._8_4_ = uVar35;
      local_1978._12_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar25 + -0x80 + lVar34 * 4);
      local_1988._4_4_ = uVar35;
      local_1988._0_4_ = uVar35;
      local_1988._8_4_ = uVar35;
      local_1988._12_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar25 + -0x70 + lVar34 * 4);
      auVar96._4_4_ = uVar35;
      auVar96._0_4_ = uVar35;
      auVar96._8_4_ = uVar35;
      auVar96._12_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar25 + -0x60 + lVar34 * 4);
      uVar1 = *(undefined4 *)(lVar25 + -0x50 + lVar34 * 4);
      uVar2 = *(undefined4 *)(lVar25 + -0x40 + lVar34 * 4);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar25 + -0x30 + lVar34 * 4)));
      auVar45 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar25 + -0x20 + lVar34 * 4)));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar25 + -0x10 + lVar34 * 4)));
      local_1868 = *(undefined8 *)(lVar23 + 0xd0);
      uStack_1860 = *(undefined8 *)(lVar23 + 0xd8);
      auVar38 = *(undefined1 (*) [16])ray;
      auVar42 = *(undefined1 (*) [16])(ray + 0x10);
      auVar39 = *(undefined1 (*) [16])(ray + 0x20);
      auVar40 = *(undefined1 (*) [16])(ray + 0x40);
      auVar41 = *(undefined1 (*) [16])(ray + 0x50);
      auVar62 = *(undefined1 (*) [16])(ray + 0x60);
      auVar64 = vsubps_avx(auVar64,auVar38);
      auVar74 = vsubps_avx(auVar74,auVar42);
      auVar76 = vsubps_avx(auVar76,auVar39);
      auVar60 = vsubps_avx(local_1978,auVar38);
      auVar61 = vsubps_avx(local_1988,auVar42);
      auVar47 = vsubps_avx512vl(auVar96,auVar39);
      auVar48 = vsubps_avx512vl(auVar44,auVar38);
      auVar49 = vsubps_avx512vl(auVar45,auVar42);
      auVar50 = vsubps_avx512vl(auVar46,auVar39);
      auVar51 = vsubps_avx512vl(auVar48,auVar64);
      auVar52 = vsubps_avx512vl(auVar49,auVar74);
      auVar53 = vsubps_avx512vl(auVar50,auVar76);
      auVar54 = vsubps_avx512vl(auVar64,auVar60);
      auVar55 = vsubps_avx512vl(auVar74,auVar61);
      auVar56 = vsubps_avx512vl(auVar76,auVar47);
      auVar39 = vaddps_avx512vl(auVar48,auVar64);
      auVar57 = vaddps_avx512vl(auVar49,auVar74);
      auVar38 = vaddps_avx512vl(auVar50,auVar76);
      auVar42._0_4_ = auVar53._0_4_ * auVar57._0_4_;
      auVar42._4_4_ = auVar53._4_4_ * auVar57._4_4_;
      auVar42._8_4_ = auVar53._8_4_ * auVar57._8_4_;
      auVar42._12_4_ = auVar53._12_4_ * auVar57._12_4_;
      auVar42 = vfmsub231ps_fma(auVar42,auVar52,auVar38);
      auVar63._0_4_ = auVar51._0_4_ * auVar38._0_4_;
      auVar63._4_4_ = auVar51._4_4_ * auVar38._4_4_;
      auVar63._8_4_ = auVar51._8_4_ * auVar38._8_4_;
      auVar63._12_4_ = auVar51._12_4_ * auVar38._12_4_;
      auVar38 = vfmsub231ps_fma(auVar63,auVar53,auVar39);
      auVar58._0_4_ = auVar52._0_4_ * auVar39._0_4_;
      auVar58._4_4_ = auVar52._4_4_ * auVar39._4_4_;
      auVar58._8_4_ = auVar52._8_4_ * auVar39._8_4_;
      auVar58._12_4_ = auVar52._12_4_ * auVar39._12_4_;
      auVar39 = vfmsub231ps_fma(auVar58,auVar51,auVar57);
      fVar90 = auVar62._0_4_;
      auVar57._0_4_ = fVar90 * auVar39._0_4_;
      fVar93 = auVar62._4_4_;
      auVar57._4_4_ = fVar93 * auVar39._4_4_;
      fVar94 = auVar62._8_4_;
      auVar57._8_4_ = fVar94 * auVar39._8_4_;
      fVar95 = auVar62._12_4_;
      auVar57._12_4_ = fVar95 * auVar39._12_4_;
      auVar38 = vfmadd231ps_fma(auVar57,auVar41,auVar38);
      auVar38 = vfmadd231ps_fma(auVar38,auVar40,auVar42);
      auVar59._0_4_ = auVar60._0_4_ + auVar64._0_4_;
      auVar59._4_4_ = auVar60._4_4_ + auVar64._4_4_;
      auVar59._8_4_ = auVar60._8_4_ + auVar64._8_4_;
      auVar59._12_4_ = auVar60._12_4_ + auVar64._12_4_;
      auVar77._0_4_ = auVar61._0_4_ + auVar74._0_4_;
      auVar77._4_4_ = auVar61._4_4_ + auVar74._4_4_;
      auVar77._8_4_ = auVar61._8_4_ + auVar74._8_4_;
      auVar77._12_4_ = auVar61._12_4_ + auVar74._12_4_;
      auVar42 = vaddps_avx512vl(auVar76,auVar47);
      auVar39 = vmulps_avx512vl(auVar77,auVar56);
      auVar39 = vfmsub231ps_avx512vl(auVar39,auVar55,auVar42);
      auVar42 = vmulps_avx512vl(auVar42,auVar54);
      auVar42 = vfmsub231ps_avx512vl(auVar42,auVar56,auVar59);
      auVar57 = vmulps_avx512vl(auVar59,auVar55);
      auVar57 = vfmsub231ps_avx512vl(auVar57,auVar54,auVar77);
      auVar58 = vsubps_avx512vl(auVar60,auVar48);
      auVar79._0_4_ = fVar90 * auVar57._0_4_;
      auVar79._4_4_ = fVar93 * auVar57._4_4_;
      auVar79._8_4_ = fVar94 * auVar57._8_4_;
      auVar79._12_4_ = fVar95 * auVar57._12_4_;
      auVar42 = vfmadd231ps_avx512vl(auVar79,auVar41,auVar42);
      auVar57 = vsubps_avx512vl(auVar61,auVar49);
      auVar42 = vfmadd231ps_fma(auVar42,auVar40,auVar39);
      auVar59 = vsubps_avx512vl(auVar47,auVar50);
      auVar39 = vaddps_avx512vl(auVar60,auVar48);
      auVar60 = vaddps_avx512vl(auVar61,auVar49);
      auVar61 = vaddps_avx512vl(auVar47,auVar50);
      auVar47 = vmulps_avx512vl(auVar60,auVar59);
      auVar47 = vfmsub231ps_avx512vl(auVar47,auVar57,auVar61);
      auVar61 = vmulps_avx512vl(auVar61,auVar58);
      auVar61 = vfmsub231ps_avx512vl(auVar61,auVar59,auVar39);
      auVar48._0_4_ = auVar39._0_4_ * auVar57._0_4_;
      auVar48._4_4_ = auVar39._4_4_ * auVar57._4_4_;
      auVar48._8_4_ = auVar39._8_4_ * auVar57._8_4_;
      auVar48._12_4_ = auVar39._12_4_ * auVar57._12_4_;
      auVar39 = vfmsub231ps_fma(auVar48,auVar58,auVar60);
      auVar39 = vmulps_avx512vl(auVar39,auVar62);
      auVar39 = vfmadd231ps_avx512vl(auVar39,auVar41,auVar61);
      auVar39 = vfmadd231ps_avx512vl(auVar39,auVar40,auVar47);
      auVar60._0_4_ = auVar38._0_4_ + auVar42._0_4_;
      auVar60._4_4_ = auVar38._4_4_ + auVar42._4_4_;
      auVar60._8_4_ = auVar38._8_4_ + auVar42._8_4_;
      auVar60._12_4_ = auVar38._12_4_ + auVar42._12_4_;
      auVar62 = vaddps_avx512vl(auVar39,auVar60);
      auVar49 = auVar98._0_16_;
      auVar60 = vandps_avx512vl(auVar62,auVar49);
      auVar61 = vmulps_avx512vl(auVar60,auVar103._0_16_);
      auVar47 = vminps_avx512vl(auVar38,auVar42);
      auVar47 = vminps_avx512vl(auVar47,auVar39);
      auVar48 = vxorps_avx512vl(auVar61,auVar97._0_16_);
      uVar11 = vcmpps_avx512vl(auVar47,auVar48,5);
      auVar47 = vmaxps_avx512vl(auVar38,auVar42);
      auVar39 = vmaxps_avx512vl(auVar47,auVar39);
      uVar15 = vcmpps_avx512vl(auVar39,auVar61,2);
      bVar26 = ((byte)uVar11 | (byte)uVar15) & 0xf & bVar27;
      if (bVar26 != 0) {
        auVar39 = vmulps_avx512vl(auVar55,auVar53);
        auVar61 = vmulps_avx512vl(auVar51,auVar56);
        auVar47 = vmulps_avx512vl(auVar54,auVar52);
        auVar48 = vmulps_avx512vl(auVar57,auVar56);
        auVar50 = vmulps_avx512vl(auVar54,auVar59);
        auVar63 = vmulps_avx512vl(auVar58,auVar55);
        auVar52 = vfmsub213ps_avx512vl(auVar52,auVar56,auVar39);
        auVar53 = vfmsub213ps_avx512vl(auVar53,auVar54,auVar61);
        auVar51 = vfmsub213ps_avx512vl(auVar51,auVar55,auVar47);
        auVar55 = vfmsub213ps_avx512vl(auVar59,auVar55,auVar48);
        auVar56 = vfmsub213ps_avx512vl(auVar58,auVar56,auVar50);
        auVar54 = vfmsub213ps_avx512vl(auVar57,auVar54,auVar63);
        auVar39 = vandps_avx512vl(auVar39,auVar49);
        auVar48 = vandps_avx512vl(auVar48,auVar49);
        uVar12 = vcmpps_avx512vl(auVar39,auVar48,1);
        auVar39 = vandps_avx512vl(auVar61,auVar49);
        auVar61 = vandps_avx512vl(auVar50,auVar49);
        uVar13 = vcmpps_avx512vl(auVar39,auVar61,1);
        auVar39 = vandps_avx512vl(auVar47,auVar49);
        auVar61 = vandps_avx512vl(auVar63,auVar49);
        uVar14 = vcmpps_avx512vl(auVar39,auVar61,1);
        bVar21 = (bool)((byte)uVar12 & 1);
        local_18f8._0_4_ = (uint)bVar21 * auVar52._0_4_ | (uint)!bVar21 * auVar55._0_4_;
        bVar21 = (bool)((byte)(uVar12 >> 1) & 1);
        local_18f8._4_4_ = (uint)bVar21 * auVar52._4_4_ | (uint)!bVar21 * auVar55._4_4_;
        bVar21 = (bool)((byte)(uVar12 >> 2) & 1);
        local_18f8._8_4_ = (uint)bVar21 * auVar52._8_4_ | (uint)!bVar21 * auVar55._8_4_;
        bVar21 = (bool)((byte)(uVar12 >> 3) & 1);
        local_18f8._12_4_ = (uint)bVar21 * auVar52._12_4_ | (uint)!bVar21 * auVar55._12_4_;
        bVar21 = (bool)((byte)uVar13 & 1);
        local_18f8._16_4_ = (uint)bVar21 * auVar53._0_4_ | (uint)!bVar21 * auVar56._0_4_;
        bVar21 = (bool)((byte)(uVar13 >> 1) & 1);
        local_18f8._20_4_ = (uint)bVar21 * auVar53._4_4_ | (uint)!bVar21 * auVar56._4_4_;
        bVar21 = (bool)((byte)(uVar13 >> 2) & 1);
        local_18f8._24_4_ = (uint)bVar21 * auVar53._8_4_ | (uint)!bVar21 * auVar56._8_4_;
        bVar21 = (bool)((byte)(uVar13 >> 3) & 1);
        local_18f8._28_4_ = (uint)bVar21 * auVar53._12_4_ | (uint)!bVar21 * auVar56._12_4_;
        bVar21 = (bool)((byte)uVar14 & 1);
        local_18f8._32_4_ = (float)((uint)bVar21 * auVar51._0_4_ | (uint)!bVar21 * auVar54._0_4_);
        bVar21 = (bool)((byte)(uVar14 >> 1) & 1);
        local_18f8._36_4_ = (float)((uint)bVar21 * auVar51._4_4_ | (uint)!bVar21 * auVar54._4_4_);
        bVar21 = (bool)((byte)(uVar14 >> 2) & 1);
        local_18f8._40_4_ = (float)((uint)bVar21 * auVar51._8_4_ | (uint)!bVar21 * auVar54._8_4_);
        bVar21 = (bool)((byte)(uVar14 >> 3) & 1);
        local_18f8._44_4_ = (float)((uint)bVar21 * auVar51._12_4_ | (uint)!bVar21 * auVar54._12_4_);
        auVar47._0_4_ = fVar90 * local_18f8._32_4_;
        auVar47._4_4_ = fVar93 * local_18f8._36_4_;
        auVar47._8_4_ = fVar94 * local_18f8._40_4_;
        auVar47._12_4_ = fVar95 * local_18f8._44_4_;
        auVar39 = vfmadd213ps_fma(auVar41,(undefined1  [16])local_18f8.field_0.y.field_0,auVar47);
        auVar39 = vfmadd213ps_fma(auVar40,(undefined1  [16])local_18f8.field_0.x.field_0,auVar39);
        auVar61._0_4_ = auVar39._0_4_ + auVar39._0_4_;
        auVar61._4_4_ = auVar39._4_4_ + auVar39._4_4_;
        auVar61._8_4_ = auVar39._8_4_ + auVar39._8_4_;
        auVar61._12_4_ = auVar39._12_4_ + auVar39._12_4_;
        auVar39._0_4_ = auVar76._0_4_ * local_18f8._32_4_;
        auVar39._4_4_ = auVar76._4_4_ * local_18f8._36_4_;
        auVar39._8_4_ = auVar76._8_4_ * local_18f8._40_4_;
        auVar39._12_4_ = auVar76._12_4_ * local_18f8._44_4_;
        auVar39 = vfmadd213ps_fma(auVar74,(undefined1  [16])local_18f8.field_0.y.field_0,auVar39);
        auVar40 = vfmadd213ps_fma(auVar64,(undefined1  [16])local_18f8.field_0.x.field_0,auVar39);
        auVar39 = vrcp14ps_avx512vl(auVar61);
        auVar41 = vxorps_avx512vl(auVar61,auVar97._0_16_);
        auVar74 = auVar99._0_16_;
        auVar64 = vfnmadd213ps_avx512vl(auVar39,auVar61,auVar74);
        auVar39 = vfmadd132ps_fma(auVar64,auVar39,auVar39);
        local_18c8._0_4_ = auVar39._0_4_ * (auVar40._0_4_ + auVar40._0_4_);
        local_18c8._4_4_ = auVar39._4_4_ * (auVar40._4_4_ + auVar40._4_4_);
        local_18c8._8_4_ = auVar39._8_4_ * (auVar40._8_4_ + auVar40._8_4_);
        local_18c8._12_4_ = auVar39._12_4_ * (auVar40._12_4_ + auVar40._12_4_);
        uVar11 = vcmpps_avx512vl(local_18c8,*(undefined1 (*) [16])(ray + 0x80),2);
        uVar15 = vcmpps_avx512vl(local_18c8,*(undefined1 (*) [16])(ray + 0x30),0xd);
        uVar16 = vcmpps_avx512vl(auVar61,auVar41,4);
        bVar26 = bVar26 & (byte)uVar11 & (byte)uVar15 & (byte)uVar16;
        if (bVar26 != 0) {
          local_1968._0_8_ = uVar37;
          pGVar6 = (context->scene->geometries).items[uVar37].ptr;
          uVar3 = pGVar6->mask;
          auVar40._4_4_ = uVar3;
          auVar40._0_4_ = uVar3;
          auVar40._8_4_ = uVar3;
          auVar40._12_4_ = uVar3;
          uVar11 = vptestmd_avx512vl(auVar40,*(undefined1 (*) [16])(ray + 0x90));
          bVar26 = bVar26 & (byte)uVar11 & 0xf;
          uVar37 = (ulong)bVar26;
          if (bVar26 != 0) {
            local_198c = *(undefined4 *)((long)&local_1868 + lVar34 * 4);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar41._8_4_ = 0x219392ef;
              auVar41._0_8_ = 0x219392ef219392ef;
              auVar41._12_4_ = 0x219392ef;
              uVar12 = vcmpps_avx512vl(auVar60,auVar41,5);
              auVar39 = vrcp14ps_avx512vl(auVar62);
              auVar40 = vfnmadd213ps_avx512vl(auVar62,auVar39,auVar74);
              auVar39 = vfmadd132ps_avx512vl(auVar40,auVar39,auVar39);
              fVar90 = (float)((uint)((byte)uVar12 & 1) * auVar39._0_4_);
              fVar93 = (float)((uint)((byte)(uVar12 >> 1) & 1) * auVar39._4_4_);
              fVar94 = (float)((uint)((byte)(uVar12 >> 2) & 1) * auVar39._8_4_);
              fVar95 = (float)((uint)((byte)(uVar12 >> 3) & 1) * auVar39._12_4_);
              auVar49._0_4_ = fVar90 * auVar38._0_4_;
              auVar49._4_4_ = fVar93 * auVar38._4_4_;
              auVar49._8_4_ = fVar94 * auVar38._8_4_;
              auVar49._12_4_ = fVar95 * auVar38._12_4_;
              local_18a8 = vminps_avx512vl(auVar49,auVar74);
              auVar38._0_4_ = fVar90 * auVar42._0_4_;
              auVar38._4_4_ = fVar93 * auVar42._4_4_;
              auVar38._8_4_ = fVar94 * auVar42._8_4_;
              auVar38._12_4_ = fVar95 * auVar42._12_4_;
              local_18b8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vminps_avx512vl(auVar38,auVar74);
              args.valid = (int *)&Ng;
              args.geometryUserPtr = &t;
              args.context = (RTCRayQueryContext *)&v;
              args.ray = (RTCRayN *)&u;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                   *)&local_18f8.field_0);
              local_1898 = vpbroadcastd_avx512vl();
              local_18a8 = vpbroadcastd_avx512vl();
              local_18b8 = v.field_0;
              vpcmpeqd_avx2(ZEXT1632(local_1898),ZEXT1632(local_1898));
              uStack_1884 = context->user->instID[0];
              local_1888 = uStack_1884;
              uStack_1880 = uStack_1884;
              uStack_187c = uStack_1884;
              uStack_1878 = context->user->instPrimID[0];
              uStack_1874 = uStack_1878;
              uStack_1870 = uStack_1878;
              uStack_186c = uStack_1878;
              local_1968 = *(undefined1 (*) [16])(ray + 0x80);
              auVar38 = vblendmps_avx512vl(local_1968,(undefined1  [16])t.field_0);
              bVar21 = (bool)(bVar26 >> 1 & 1);
              bVar8 = (bool)(bVar26 >> 2 & 1);
              *(uint *)(ray + 0x80) =
                   (uint)(bVar26 & 1) * auVar38._0_4_ | !(bool)(bVar26 & 1) * uStack_1878;
              *(uint *)(ray + 0x84) = (uint)bVar21 * auVar38._4_4_ | !bVar21 * uStack_1878;
              *(uint *)(ray + 0x88) = (uint)bVar8 * auVar38._8_4_ | !bVar8 * uStack_1878;
              *(uint *)(ray + 0x8c) =
                   (uint)(bVar26 >> 3) * auVar38._12_4_ | !(bool)(bVar26 >> 3) * uStack_1878;
              local_19a8 = vpmovm2d_avx512vl(uVar37);
              args.valid = (int *)local_19a8;
              args.geometryUserPtr = pGVar6->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)&local_18f8;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar6->occlusionFilterN)(&args);
              }
              uVar37 = vptestmd_avx512vl(local_19a8,local_19a8);
              if ((uVar37 & 0xf) == 0) {
                uVar37 = 0;
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar98 = ZEXT1664(auVar38);
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar99 = ZEXT1664(auVar38);
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar100 = ZEXT1664(auVar38);
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar101 = ZEXT1664(auVar38);
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar102 = ZEXT1664(auVar38);
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar103 = ZEXT1664(auVar38);
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar97 = ZEXT1664(auVar38);
              }
              else {
                p_Var7 = context->args->filter;
                if (p_Var7 == (RTCFilterFunctionN)0x0) {
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar98 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar99 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar100 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar101 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar102 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar103 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar97 = ZEXT1664(auVar38);
                }
                else {
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar98 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar99 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar100 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar101 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar102 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar103 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar97 = ZEXT1664(auVar38);
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar6->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    (*p_Var7)(&args);
                    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar97 = ZEXT1664(auVar38);
                    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                    auVar103 = ZEXT1664(auVar38);
                    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar102 = ZEXT1664(auVar38);
                    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar101 = ZEXT1664(auVar38);
                    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar100 = ZEXT1664(auVar38);
                    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar99 = ZEXT1664(auVar38);
                    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar98 = ZEXT1664(auVar38);
                  }
                }
                uVar37 = vptestmd_avx512vl(local_19a8,local_19a8);
                uVar37 = uVar37 & 0xf;
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar21 = (bool)((byte)uVar37 & 1);
                auVar50._0_4_ =
                     (uint)bVar21 * auVar38._0_4_ | (uint)!bVar21 * *(int *)(args.ray + 0x80);
                bVar21 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar50._4_4_ =
                     (uint)bVar21 * auVar38._4_4_ | (uint)!bVar21 * *(int *)(args.ray + 0x84);
                bVar21 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar50._8_4_ =
                     (uint)bVar21 * auVar38._8_4_ | (uint)!bVar21 * *(int *)(args.ray + 0x88);
                bVar21 = SUB81(uVar37 >> 3,0);
                auVar50._12_4_ =
                     (uint)bVar21 * auVar38._12_4_ | (uint)!bVar21 * *(int *)(args.ray + 0x8c);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar50;
              }
              bVar21 = (bool)((byte)uVar37 & 1);
              auVar51._0_4_ = (uint)bVar21 * *(int *)local_1998 | (uint)!bVar21 * local_1968._0_4_;
              bVar21 = (bool)((byte)(uVar37 >> 1) & 1);
              auVar51._4_4_ =
                   (uint)bVar21 * *(int *)(local_1998 + 4) | (uint)!bVar21 * local_1968._4_4_;
              bVar21 = (bool)((byte)(uVar37 >> 2) & 1);
              auVar51._8_4_ =
                   (uint)bVar21 * *(int *)(local_1998 + 8) | (uint)!bVar21 * local_1968._8_4_;
              bVar21 = SUB81(uVar37 >> 3,0);
              auVar51._12_4_ =
                   (uint)bVar21 * *(int *)(local_1998 + 0xc) | (uint)!bVar21 * local_1968._12_4_;
              *(undefined1 (*) [16])local_1998 = auVar51;
            }
            bVar27 = ((byte)uVar37 ^ 0xf) & bVar27;
          }
        }
      }
      if (bVar27 == 0) break;
      auVar38 = *(undefined1 (*) [16])ray;
      auVar42 = *(undefined1 (*) [16])(ray + 0x10);
      auVar39 = *(undefined1 (*) [16])(ray + 0x20);
      auVar40 = *(undefined1 (*) [16])(ray + 0x40);
      auVar41 = *(undefined1 (*) [16])(ray + 0x50);
      auVar62 = *(undefined1 (*) [16])(ray + 0x60);
      auVar54._4_4_ = uVar35;
      auVar54._0_4_ = uVar35;
      auVar54._8_4_ = uVar35;
      auVar54._12_4_ = uVar35;
      auVar64 = vsubps_avx(auVar54,auVar38);
      auVar53._4_4_ = uVar1;
      auVar53._0_4_ = uVar1;
      auVar53._8_4_ = uVar1;
      auVar53._12_4_ = uVar1;
      auVar74 = vsubps_avx(auVar53,auVar42);
      auVar52._4_4_ = uVar2;
      auVar52._0_4_ = uVar2;
      auVar52._8_4_ = uVar2;
      auVar52._12_4_ = uVar2;
      auVar76 = vsubps_avx(auVar52,auVar39);
      auVar60 = vsubps_avx(auVar44,auVar38);
      auVar61 = vsubps_avx(auVar45,auVar42);
      auVar44 = vsubps_avx512vl(auVar46,auVar39);
      auVar45 = vsubps_avx512vl(local_1978,auVar38);
      auVar42 = vsubps_avx512vl(local_1988,auVar42);
      auVar39 = vsubps_avx512vl(auVar96,auVar39);
      auVar46 = vsubps_avx512vl(auVar45,auVar64);
      auVar47 = vsubps_avx512vl(auVar42,auVar74);
      auVar48 = vsubps_avx512vl(auVar39,auVar76);
      auVar49 = vsubps_avx512vl(auVar64,auVar60);
      auVar50 = vsubps_avx512vl(auVar74,auVar61);
      auVar51 = vsubps_avx512vl(auVar76,auVar44);
      auVar52 = vsubps_avx512vl(auVar60,auVar45);
      auVar53 = vsubps_avx512vl(auVar61,auVar42);
      auVar54 = vsubps_avx512vl(auVar44,auVar39);
      auVar38 = vaddps_avx512vl(auVar45,auVar64);
      auVar55 = vaddps_avx512vl(auVar42,auVar74);
      auVar56 = vaddps_avx512vl(auVar39,auVar76);
      auVar57 = vmulps_avx512vl(auVar55,auVar48);
      auVar57 = vfmsub231ps_avx512vl(auVar57,auVar47,auVar56);
      auVar56 = vmulps_avx512vl(auVar56,auVar46);
      auVar56 = vfmsub231ps_avx512vl(auVar56,auVar48,auVar38);
      auVar80._0_4_ = auVar47._0_4_ * auVar38._0_4_;
      auVar80._4_4_ = auVar47._4_4_ * auVar38._4_4_;
      auVar80._8_4_ = auVar47._8_4_ * auVar38._8_4_;
      auVar80._12_4_ = auVar47._12_4_ * auVar38._12_4_;
      auVar38 = vfmsub231ps_fma(auVar80,auVar46,auVar55);
      fVar90 = auVar62._0_4_;
      auVar55._0_4_ = fVar90 * auVar38._0_4_;
      fVar93 = auVar62._4_4_;
      auVar55._4_4_ = fVar93 * auVar38._4_4_;
      fVar94 = auVar62._8_4_;
      auVar55._8_4_ = fVar94 * auVar38._8_4_;
      fVar95 = auVar62._12_4_;
      auVar55._12_4_ = fVar95 * auVar38._12_4_;
      auVar38 = vfmadd231ps_avx512vl(auVar55,auVar41,auVar56);
      auVar55 = vfmadd231ps_avx512vl(auVar38,auVar40,auVar57);
      auVar82._0_4_ = auVar60._0_4_ + auVar64._0_4_;
      auVar82._4_4_ = auVar60._4_4_ + auVar64._4_4_;
      auVar82._8_4_ = auVar60._8_4_ + auVar64._8_4_;
      auVar82._12_4_ = auVar60._12_4_ + auVar64._12_4_;
      auVar38 = vaddps_avx512vl(auVar74,auVar61);
      auVar56 = vaddps_avx512vl(auVar76,auVar44);
      auVar57 = vmulps_avx512vl(auVar38,auVar51);
      auVar57 = vfmsub231ps_avx512vl(auVar57,auVar50,auVar56);
      auVar56 = vmulps_avx512vl(auVar56,auVar49);
      auVar56 = vfmsub231ps_avx512vl(auVar56,auVar51,auVar82);
      auVar58 = vmulps_avx512vl(auVar82,auVar50);
      auVar38 = vfmsub231ps_avx512vl(auVar58,auVar49,auVar38);
      auVar83._0_4_ = fVar90 * auVar38._0_4_;
      auVar83._4_4_ = fVar93 * auVar38._4_4_;
      auVar83._8_4_ = fVar94 * auVar38._8_4_;
      auVar83._12_4_ = fVar95 * auVar38._12_4_;
      auVar38 = vfmadd231ps_avx512vl(auVar83,auVar41,auVar56);
      auVar56 = vfmadd231ps_avx512vl(auVar38,auVar40,auVar57);
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar97 = ZEXT1664(auVar57);
      auVar38 = vaddps_avx512vl(auVar60,auVar45);
      auVar42 = vaddps_avx512vl(auVar61,auVar42);
      auVar39 = vaddps_avx512vl(auVar44,auVar39);
      auVar60 = vmulps_avx512vl(auVar42,auVar54);
      auVar60 = vfmsub231ps_avx512vl(auVar60,auVar53,auVar39);
      auVar39 = vmulps_avx512vl(auVar39,auVar52);
      auVar39 = vfmsub231ps_avx512vl(auVar39,auVar54,auVar38);
      auVar44._0_4_ = auVar38._0_4_ * auVar53._0_4_;
      auVar44._4_4_ = auVar38._4_4_ * auVar53._4_4_;
      auVar44._8_4_ = auVar38._8_4_ * auVar53._8_4_;
      auVar44._12_4_ = auVar38._12_4_ * auVar53._12_4_;
      auVar38 = vfmsub231ps_fma(auVar44,auVar52,auVar42);
      auVar38 = vmulps_avx512vl(auVar38,auVar62);
      auVar38 = vfmadd231ps_avx512vl(auVar38,auVar41,auVar39);
      auVar38 = vfmadd231ps_avx512vl(auVar38,auVar40,auVar60);
      auVar45._0_4_ = auVar55._0_4_ + auVar56._0_4_;
      auVar45._4_4_ = auVar55._4_4_ + auVar56._4_4_;
      auVar45._8_4_ = auVar55._8_4_ + auVar56._8_4_;
      auVar45._12_4_ = auVar55._12_4_ + auVar56._12_4_;
      auVar42 = vaddps_avx512vl(auVar38,auVar45);
      auVar44 = auVar98._0_16_;
      auVar39 = vandps_avx512vl(auVar42,auVar44);
      auVar62 = vmulps_avx512vl(auVar39,auVar103._0_16_);
      auVar60 = vminps_avx512vl(auVar55,auVar56);
      auVar60 = vminps_avx512vl(auVar60,auVar38);
      auVar61 = vxorps_avx512vl(auVar62,auVar57);
      uVar11 = vcmpps_avx512vl(auVar60,auVar61,5);
      auVar60 = vmaxps_avx512vl(auVar55,auVar56);
      auVar38 = vmaxps_avx512vl(auVar60,auVar38);
      uVar15 = vcmpps_avx512vl(auVar38,auVar62,2);
      bVar26 = ((byte)uVar11 | (byte)uVar15) & 0xf & bVar27;
      if (bVar26 != 0) {
        auVar38 = vmulps_avx512vl(auVar50,auVar48);
        auVar62 = vmulps_avx512vl(auVar46,auVar51);
        auVar60 = vmulps_avx512vl(auVar49,auVar47);
        auVar61 = vmulps_avx512vl(auVar53,auVar51);
        auVar45 = vmulps_avx512vl(auVar49,auVar54);
        auVar58 = vmulps_avx512vl(auVar52,auVar50);
        auVar47 = vfmsub213ps_avx512vl(auVar47,auVar51,auVar38);
        auVar48 = vfmsub213ps_avx512vl(auVar48,auVar49,auVar62);
        auVar46 = vfmsub213ps_avx512vl(auVar46,auVar50,auVar60);
        auVar50 = vfmsub213ps_avx512vl(auVar54,auVar50,auVar61);
        auVar51 = vfmsub213ps_avx512vl(auVar52,auVar51,auVar45);
        auVar49 = vfmsub213ps_avx512vl(auVar53,auVar49,auVar58);
        auVar38 = vandps_avx512vl(auVar38,auVar44);
        auVar61 = vandps_avx512vl(auVar61,auVar44);
        uVar37 = vcmpps_avx512vl(auVar38,auVar61,1);
        auVar38 = vandps_avx512vl(auVar62,auVar44);
        auVar62 = vandps_avx512vl(auVar45,auVar44);
        uVar12 = vcmpps_avx512vl(auVar38,auVar62,1);
        auVar38 = vandps_avx512vl(auVar60,auVar44);
        auVar62 = vandps_avx512vl(auVar58,auVar44);
        uVar13 = vcmpps_avx512vl(auVar38,auVar62,1);
        bVar21 = (bool)((byte)uVar37 & 1);
        local_18f8._0_4_ = (uint)bVar21 * auVar47._0_4_ | (uint)!bVar21 * auVar50._0_4_;
        bVar21 = (bool)((byte)(uVar37 >> 1) & 1);
        local_18f8._4_4_ = (uint)bVar21 * auVar47._4_4_ | (uint)!bVar21 * auVar50._4_4_;
        bVar21 = (bool)((byte)(uVar37 >> 2) & 1);
        local_18f8._8_4_ = (uint)bVar21 * auVar47._8_4_ | (uint)!bVar21 * auVar50._8_4_;
        bVar21 = (bool)((byte)(uVar37 >> 3) & 1);
        local_18f8._12_4_ = (uint)bVar21 * auVar47._12_4_ | (uint)!bVar21 * auVar50._12_4_;
        bVar21 = (bool)((byte)uVar12 & 1);
        local_18f8._16_4_ = (uint)bVar21 * auVar48._0_4_ | (uint)!bVar21 * auVar51._0_4_;
        bVar21 = (bool)((byte)(uVar12 >> 1) & 1);
        local_18f8._20_4_ = (uint)bVar21 * auVar48._4_4_ | (uint)!bVar21 * auVar51._4_4_;
        bVar21 = (bool)((byte)(uVar12 >> 2) & 1);
        local_18f8._24_4_ = (uint)bVar21 * auVar48._8_4_ | (uint)!bVar21 * auVar51._8_4_;
        bVar21 = (bool)((byte)(uVar12 >> 3) & 1);
        local_18f8._28_4_ = (uint)bVar21 * auVar48._12_4_ | (uint)!bVar21 * auVar51._12_4_;
        bVar21 = (bool)((byte)uVar13 & 1);
        local_18f8._32_4_ = (float)((uint)bVar21 * auVar46._0_4_ | (uint)!bVar21 * auVar49._0_4_);
        bVar21 = (bool)((byte)(uVar13 >> 1) & 1);
        local_18f8._36_4_ = (float)((uint)bVar21 * auVar46._4_4_ | (uint)!bVar21 * auVar49._4_4_);
        bVar21 = (bool)((byte)(uVar13 >> 2) & 1);
        local_18f8._40_4_ = (float)((uint)bVar21 * auVar46._8_4_ | (uint)!bVar21 * auVar49._8_4_);
        bVar21 = (bool)((byte)(uVar13 >> 3) & 1);
        local_18f8._44_4_ = (float)((uint)bVar21 * auVar46._12_4_ | (uint)!bVar21 * auVar49._12_4_);
        auVar91._0_4_ = fVar90 * local_18f8._32_4_;
        auVar91._4_4_ = fVar93 * local_18f8._36_4_;
        auVar91._8_4_ = fVar94 * local_18f8._40_4_;
        auVar91._12_4_ = fVar95 * local_18f8._44_4_;
        auVar38 = vfmadd213ps_fma(auVar41,(undefined1  [16])local_18f8.field_0.y.field_0,auVar91);
        auVar38 = vfmadd213ps_fma(auVar40,(undefined1  [16])local_18f8.field_0.x.field_0,auVar38);
        auVar46._0_4_ = auVar38._0_4_ + auVar38._0_4_;
        auVar46._4_4_ = auVar38._4_4_ + auVar38._4_4_;
        auVar46._8_4_ = auVar38._8_4_ + auVar38._8_4_;
        auVar46._12_4_ = auVar38._12_4_ + auVar38._12_4_;
        auVar88._0_4_ = auVar76._0_4_ * local_18f8._32_4_;
        auVar88._4_4_ = auVar76._4_4_ * local_18f8._36_4_;
        auVar88._8_4_ = auVar76._8_4_ * local_18f8._40_4_;
        auVar88._12_4_ = auVar76._12_4_ * local_18f8._44_4_;
        auVar38 = vfmadd213ps_fma(auVar74,(undefined1  [16])local_18f8.field_0.y.field_0,auVar88);
        auVar40 = vfmadd213ps_fma(auVar64,(undefined1  [16])local_18f8.field_0.x.field_0,auVar38);
        auVar38 = vrcp14ps_avx512vl(auVar46);
        auVar41 = vxorps_avx512vl(auVar46,auVar57);
        auVar64 = auVar99._0_16_;
        auVar62 = vfnmadd213ps_avx512vl(auVar38,auVar46,auVar64);
        auVar38 = vfmadd132ps_fma(auVar62,auVar38,auVar38);
        local_18c8._0_4_ = auVar38._0_4_ * (auVar40._0_4_ + auVar40._0_4_);
        local_18c8._4_4_ = auVar38._4_4_ * (auVar40._4_4_ + auVar40._4_4_);
        local_18c8._8_4_ = auVar38._8_4_ * (auVar40._8_4_ + auVar40._8_4_);
        local_18c8._12_4_ = auVar38._12_4_ * (auVar40._12_4_ + auVar40._12_4_);
        uVar11 = vcmpps_avx512vl(local_18c8,*(undefined1 (*) [16])(ray + 0x80),2);
        uVar15 = vcmpps_avx512vl(local_18c8,*(undefined1 (*) [16])(ray + 0x30),0xd);
        uVar16 = vcmpps_avx512vl(auVar46,auVar41,4);
        bVar26 = bVar26 & (byte)uVar11 & (byte)uVar15 & (byte)uVar16;
        if (bVar26 != 0) {
          pGVar6 = (context->scene->geometries).items[*(uint *)(lVar25 + lVar34 * 4)].ptr;
          local_1978._0_8_ = pGVar6;
          uVar3 = pGVar6->mask;
          auVar86._4_4_ = uVar3;
          auVar86._0_4_ = uVar3;
          auVar86._8_4_ = uVar3;
          auVar86._12_4_ = uVar3;
          uVar11 = vptestmd_avx512vl(auVar86,*(undefined1 (*) [16])(ray + 0x90));
          bVar26 = bVar26 & (byte)uVar11 & 0xf;
          uVar37 = (ulong)bVar26;
          if (bVar26 != 0) {
            local_1988._0_4_ = *(undefined4 *)((long)&local_1868 + lVar34 * 4);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar17._8_4_ = 0x219392ef;
              auVar17._0_8_ = 0x219392ef219392ef;
              auVar17._12_4_ = 0x219392ef;
              uVar12 = vcmpps_avx512vl(auVar39,auVar17,5);
              auVar38 = vrcp14ps_avx512vl(auVar42);
              auVar42 = vfnmadd213ps_avx512vl(auVar42,auVar38,auVar64);
              auVar38 = vfmadd132ps_avx512vl(auVar42,auVar38,auVar38);
              fVar90 = (float)((uint)((byte)uVar12 & 1) * auVar38._0_4_);
              fVar93 = (float)((uint)((byte)(uVar12 >> 1) & 1) * auVar38._4_4_);
              fVar94 = (float)((uint)((byte)(uVar12 >> 2) & 1) * auVar38._8_4_);
              fVar95 = (float)((uint)((byte)(uVar12 >> 3) & 1) * auVar38._12_4_);
              auVar81._0_4_ = fVar90 * auVar55._0_4_;
              auVar81._4_4_ = fVar93 * auVar55._4_4_;
              auVar81._8_4_ = fVar94 * auVar55._8_4_;
              auVar81._12_4_ = fVar95 * auVar55._12_4_;
              auVar38 = vminps_avx512vl(auVar81,auVar64);
              auVar84._0_4_ = fVar90 * auVar56._0_4_;
              auVar84._4_4_ = fVar93 * auVar56._4_4_;
              auVar84._8_4_ = fVar94 * auVar56._8_4_;
              auVar84._12_4_ = fVar95 * auVar56._12_4_;
              auVar42 = vminps_avx512vl(auVar84,auVar64);
              local_18a8 = vsubps_avx512vl(auVar64,auVar38);
              local_18b8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vsubps_avx512vl(auVar64,auVar42);
              args.valid = (int *)&Ng;
              args.geometryUserPtr = &t;
              args.context = (RTCRayQueryContext *)&v;
              args.ray = (RTCRayN *)&u;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                   *)&local_18f8.field_0);
              local_1898 = vpbroadcastd_avx512vl();
              local_18a8 = vpbroadcastd_avx512vl();
              local_18b8 = v.field_0;
              vpcmpeqd_avx2(ZEXT1632(local_1898),ZEXT1632(local_1898));
              uStack_1884 = context->user->instID[0];
              local_1888 = uStack_1884;
              uStack_1880 = uStack_1884;
              uStack_187c = uStack_1884;
              uStack_1878 = context->user->instPrimID[0];
              uStack_1874 = uStack_1878;
              uStack_1870 = uStack_1878;
              uStack_186c = uStack_1878;
              local_1988 = *(undefined1 (*) [16])(ray + 0x80);
              auVar38 = vblendmps_avx512vl(local_1988,(undefined1  [16])t.field_0);
              bVar21 = (bool)(bVar26 >> 1 & 1);
              bVar8 = (bool)(bVar26 >> 2 & 1);
              *(uint *)(ray + 0x80) =
                   (uint)(bVar26 & 1) * auVar38._0_4_ | !(bool)(bVar26 & 1) * uStack_1878;
              *(uint *)(ray + 0x84) = (uint)bVar21 * auVar38._4_4_ | !bVar21 * uStack_1878;
              *(uint *)(ray + 0x88) = (uint)bVar8 * auVar38._8_4_ | !bVar8 * uStack_1878;
              *(uint *)(ray + 0x8c) =
                   (uint)(bVar26 >> 3) * auVar38._12_4_ | !(bool)(bVar26 >> 3) * uStack_1878;
              local_19a8 = vpmovm2d_avx512vl(uVar37);
              args.valid = (int *)local_19a8;
              args.geometryUserPtr = *(void **)(local_1978._0_8_ + 0x18);
              args.context = context->user;
              args.hit = (RTCHitN *)&local_18f8;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (*(code **)(local_1978._0_8_ + 0x48) != (code *)0x0) {
                (**(code **)(local_1978._0_8_ + 0x48))(&args);
              }
              uVar37 = vptestmd_avx512vl(local_19a8,local_19a8);
              if ((uVar37 & 0xf) == 0) {
                uVar37 = 0;
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar98 = ZEXT1664(auVar38);
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar99 = ZEXT1664(auVar38);
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar100 = ZEXT1664(auVar38);
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar101 = ZEXT1664(auVar38);
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar102 = ZEXT1664(auVar38);
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar103 = ZEXT1664(auVar38);
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar97 = ZEXT1664(auVar38);
              }
              else {
                p_Var7 = context->args->filter;
                if (p_Var7 == (RTCFilterFunctionN)0x0) {
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar98 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar99 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar100 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar101 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar102 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar103 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar97 = ZEXT1664(auVar38);
                }
                else {
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar98 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar99 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar100 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar101 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar102 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar103 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar97 = ZEXT1664(auVar38);
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                     ((*(byte *)(local_1978._0_8_ + 0x3e) & 0x40) != 0)) {
                    (*p_Var7)(&args);
                    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar97 = ZEXT1664(auVar38);
                    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                    auVar103 = ZEXT1664(auVar38);
                    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar102 = ZEXT1664(auVar38);
                    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar101 = ZEXT1664(auVar38);
                    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar100 = ZEXT1664(auVar38);
                    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar99 = ZEXT1664(auVar38);
                    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar98 = ZEXT1664(auVar38);
                  }
                }
                uVar37 = vptestmd_avx512vl(local_19a8,local_19a8);
                uVar37 = uVar37 & 0xf;
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar21 = (bool)((byte)uVar37 & 1);
                auVar56._0_4_ =
                     (uint)bVar21 * auVar38._0_4_ | (uint)!bVar21 * *(int *)(args.ray + 0x80);
                bVar21 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar56._4_4_ =
                     (uint)bVar21 * auVar38._4_4_ | (uint)!bVar21 * *(int *)(args.ray + 0x84);
                bVar21 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar56._8_4_ =
                     (uint)bVar21 * auVar38._8_4_ | (uint)!bVar21 * *(int *)(args.ray + 0x88);
                bVar21 = SUB81(uVar37 >> 3,0);
                auVar56._12_4_ =
                     (uint)bVar21 * auVar38._12_4_ | (uint)!bVar21 * *(int *)(args.ray + 0x8c);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar56;
              }
              bVar21 = (bool)((byte)uVar37 & 1);
              auVar65._0_4_ = (uint)bVar21 * *(int *)local_1998 | (uint)!bVar21 * local_1988._0_4_;
              bVar21 = (bool)((byte)(uVar37 >> 1) & 1);
              auVar65._4_4_ =
                   (uint)bVar21 * *(int *)(local_1998 + 4) | (uint)!bVar21 * local_1988._4_4_;
              bVar21 = (bool)((byte)(uVar37 >> 2) & 1);
              auVar65._8_4_ =
                   (uint)bVar21 * *(int *)(local_1998 + 8) | (uint)!bVar21 * local_1988._8_4_;
              bVar21 = SUB81(uVar37 >> 3,0);
              auVar65._12_4_ =
                   (uint)bVar21 * *(int *)(local_1998 + 0xc) | (uint)!bVar21 * local_1988._12_4_;
              *(undefined1 (*) [16])local_1998 = auVar65;
            }
            bVar27 = ((byte)uVar37 ^ 0xf) & bVar27;
          }
        }
      }
      lVar34 = lVar34 + 1;
    } while (bVar27 != 0);
    bVar27 = 0;
LAB_01c9633a:
    lVar24 = lVar24 + 1;
    lVar25 = lVar25 + 0xe0;
    bVar30 = bVar30 & bVar27;
  } while (bVar30 != 0);
  bVar30 = 0;
LAB_01c96357:
  bVar32 = bVar32 | ~bVar30 & 0xf;
  local_1a18 = (uint)bVar32;
  if (bVar32 == 0xf) {
    bVar32 = 0xf;
    goto LAB_01c9649e;
  }
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar21 = (bool)(bVar32 >> 1 & 1);
  bVar8 = (bool)(bVar32 >> 2 & 1);
  bVar9 = (bool)(bVar32 >> 3 & 1);
  tray.tfar.field_0.i[1] = (uint)bVar21 * auVar38._4_4_ | (uint)!bVar21 * tray.tfar.field_0.i[1];
  tray.tfar.field_0.i[0] =
       (uint)(bVar32 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar32 & 1) * tray.tfar.field_0.i[0];
  tray.tfar.field_0.i[2] = (uint)bVar8 * auVar38._8_4_ | (uint)!bVar8 * tray.tfar.field_0.i[2];
  tray.tfar.field_0.i[3] = (uint)bVar9 * auVar38._12_4_ | (uint)!bVar9 * tray.tfar.field_0.i[3];
  goto LAB_01c950e4;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }